

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_3dVector * __thiscall ON_3dVector::operator=(ON_3dVector *this,float *v)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (v == (float *)0x0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
    dVar4 = 0.0;
  }
  else {
    dVar2 = (double)(float)*(undefined8 *)v;
    dVar3 = (double)(float)((ulong)*(undefined8 *)v >> 0x20);
    dVar4 = (double)v[2];
  }
  this->z = dVar4;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->x = dVar2;
  this->y = (double)auVar1._8_8_;
  return this;
}

Assistant:

ON_3dVector& ON_3dVector::operator=(const float* v)
{
  if ( v ) {
    x = (double)v[0];
    y = (double)v[1];
    z = (double)v[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}